

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntegratorFactory.cpp
# Opt level: O2

Integrator * __thiscall
OpenMD::IntegratorFactory::createIntegrator(IntegratorFactory *this,string *id,SimInfo *info)

{
  iterator iVar1;
  Integrator *pIVar2;
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::IntegratorCreator_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::IntegratorCreator_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::IntegratorCreator_*>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::IntegratorCreator_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::IntegratorCreator_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::IntegratorCreator_*>_>_>
                  *)this,id);
  if ((_Rb_tree_header *)iVar1._M_node != &(this->creatorMap_)._M_t._M_impl.super__Rb_tree_header) {
    pIVar2 = (Integrator *)
             (**(code **)(**(long **)(iVar1._M_node + 2) + 0x10))
                       (*(long **)(iVar1._M_node + 2),info);
    return pIVar2;
  }
  return (Integrator *)0x0;
}

Assistant:

Integrator* IntegratorFactory::createIntegrator(const std::string& id,
                                                  SimInfo* info) {
    CreatorMapType::iterator i = creatorMap_.find(id);
    if (i != creatorMap_.end()) {
      // invoke functor to create object
      return (i->second)->create(info);
    } else {
      return NULL;
    }
  }